

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

cmValue __thiscall cmTarget::GetProperty(cmTarget *this,string *prop)

{
  size_t sVar1;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var2;
  pointer pcVar3;
  size_t *psVar4;
  string_view *psVar5;
  __type _Var6;
  bool bVar7;
  int iVar8;
  const_iterator cVar9;
  iterator iVar10;
  _Base_ptr p_Var11;
  cmState *this_00;
  size_type __rlen_1;
  long *plVar12;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcVar13;
  size_type __rlen;
  long lVar14;
  string *this_01;
  undefined1 *puVar15;
  undefined1 auVar16 [16];
  FileSetType *fileSetTypes [2];
  string fileSetName;
  undefined1 local_449;
  cmTargetInternals *local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_440;
  undefined1 local_438 [40];
  cmStateSnapshot local_410;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  pointer local_3d8;
  pointer puStack_3d0;
  undefined1 local_3c8 [16];
  _Alloc_hider local_3b8;
  size_type sStack_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  _Alloc_hider local_398;
  size_type sStack_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  pointer local_378 [2];
  undefined1 local_368 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  undefined1 local_348 [16];
  pointer local_338;
  undefined1 local_328 [16];
  pointer local_318;
  undefined1 local_308 [16];
  pointer local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  undefined1 local_2c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined1 local_2a8 [16];
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  pointer local_278 [2];
  undefined1 local_268 [16];
  undefined1 *local_258;
  undefined1 local_248 [16];
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [2];
  undefined1 local_38 [8];
  
  local_440 = prop;
  if ((GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_ == '\0') &&
     (iVar8 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                                 ), iVar8 != 0)) {
    local_3f8._0_8_ = local_3e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3f8,(anonymous_namespace)::propC_STANDARD_abi_cxx11_,
               DAT_00b4a490 + (long)(anonymous_namespace)::propC_STANDARD_abi_cxx11_);
    local_3d8 = (pointer)local_3c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3d8,(anonymous_namespace)::propCXX_STANDARD_abi_cxx11_,
               DAT_00b4a4b0 + (long)(anonymous_namespace)::propCXX_STANDARD_abi_cxx11_);
    local_3b8._M_p = (pointer)&local_3a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3b8,(anonymous_namespace)::propCUDA_STANDARD_abi_cxx11_,
               DAT_00b4a4d0 + (long)(anonymous_namespace)::propCUDA_STANDARD_abi_cxx11_);
    local_398._M_p = (pointer)&local_388;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_398,(anonymous_namespace)::propHIP_STANDARD_abi_cxx11_,
               DAT_00b4a4f0 + (long)(anonymous_namespace)::propHIP_STANDARD_abi_cxx11_);
    local_378[0] = (pointer)local_368;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_378,(anonymous_namespace)::propOBJC_STANDARD_abi_cxx11_,
               DAT_00b4a510 + (long)(anonymous_namespace)::propOBJC_STANDARD_abi_cxx11_);
    local_358._M_allocated_capacity = (size_type)(local_368 + 0x20);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_368 + 0x10),(anonymous_namespace)::propOBJCXX_STANDARD_abi_cxx11_,
               DAT_00b4a530 + (anonymous_namespace)::propOBJCXX_STANDARD_abi_cxx11_);
    local_338 = (pointer)(local_348 + 0x20);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_348 + 0x10),(anonymous_namespace)::propLINK_LIBRARIES_abi_cxx11_,
               DAT_00b4a7b0 + (anonymous_namespace)::propLINK_LIBRARIES_abi_cxx11_);
    local_318 = (pointer)(local_328 + 0x20);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_328 + 0x10),(anonymous_namespace)::propTYPE_abi_cxx11_,
               DAT_00b4a830 + (anonymous_namespace)::propTYPE_abi_cxx11_);
    local_2f8 = (pointer)((long)local_308 + 0x20);
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)local_308 + 0x10),
               (anonymous_namespace)::propINCLUDE_DIRECTORIES_abi_cxx11_,
               DAT_00b4a6b0 + (anonymous_namespace)::propINCLUDE_DIRECTORIES_abi_cxx11_);
    local_2e8.field_2._M_allocated_capacity = (size_type)local_2c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e8.field_2,(anonymous_namespace)::propCOMPILE_FEATURES_abi_cxx11_,
               DAT_00b4a570 + (anonymous_namespace)::propCOMPILE_FEATURES_abi_cxx11_);
    local_2b8._M_allocated_capacity = (size_type)local_2a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_2c8 + 0x10),(anonymous_namespace)::propCOMPILE_OPTIONS_abi_cxx11_,
               DAT_00b4a590 + (anonymous_namespace)::propCOMPILE_OPTIONS_abi_cxx11_);
    local_298[0] = local_288;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_298,(anonymous_namespace)::propCOMPILE_DEFINITIONS_abi_cxx11_,
               DAT_00b4a550 + (anonymous_namespace)::propCOMPILE_DEFINITIONS_abi_cxx11_);
    local_278[0] = (pointer)local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_278,(anonymous_namespace)::propPRECOMPILE_HEADERS_abi_cxx11_,
               DAT_00b4a5b0 + (anonymous_namespace)::propPRECOMPILE_HEADERS_abi_cxx11_);
    local_258 = local_248;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,(anonymous_namespace)::propLINK_OPTIONS_abi_cxx11_,
               DAT_00b4a6d0 + (anonymous_namespace)::propLINK_OPTIONS_abi_cxx11_);
    local_238[0] = local_228;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_238,(anonymous_namespace)::propLINK_DIRECTORIES_abi_cxx11_,
               DAT_00b4a790 + (anonymous_namespace)::propLINK_DIRECTORIES_abi_cxx11_);
    local_218[0] = local_208;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_218,(anonymous_namespace)::propIMPORTED_abi_cxx11_,
               DAT_00b4a670 + (anonymous_namespace)::propIMPORTED_abi_cxx11_);
    local_1f8[0] = local_1e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1f8,(anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_,
               DAT_00b4a690 + (anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_);
    local_1d8[0] = local_1c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d8,(anonymous_namespace)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_
               ,DAT_00b4a7d0 + (anonymous_namespace)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
    local_1b8[0] = local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b8,(anonymous_namespace)::propNAME_abi_cxx11_,
               DAT_00b4a7f0 + (anonymous_namespace)::propNAME_abi_cxx11_);
    local_198[0] = local_188;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_198,(anonymous_namespace)::propBINARY_DIR_abi_cxx11_,
               DAT_00b4a850 + (anonymous_namespace)::propBINARY_DIR_abi_cxx11_);
    local_178[0] = local_168;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_178,(anonymous_namespace)::propSOURCE_DIR_abi_cxx11_,
               DAT_00b4a870 + (anonymous_namespace)::propSOURCE_DIR_abi_cxx11_);
    local_158[0] = local_148;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_158,(anonymous_namespace)::propSOURCES_abi_cxx11_,
               DAT_00b4a810 + (anonymous_namespace)::propSOURCES_abi_cxx11_);
    local_138[0] = local_128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_138,(anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_abi_cxx11_,
               DAT_00b4a8d0 + (anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_abi_cxx11_);
    local_118[0] = local_108;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_118,
               (anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_,
               DAT_00b4a8f0 + (anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_)
    ;
    local_f8[0] = local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_f8,
               (anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_,
               DAT_00b4a910 +
               (anonymous_namespace)::propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_);
    local_d8[0] = local_c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d8,
               (anonymous_namespace)::propIMPORTED_CXX_MODULES_INCLUDE_DIRECTORIES_abi_cxx11_,
               DAT_00b4a6f0 +
               (anonymous_namespace)::propIMPORTED_CXX_MODULES_INCLUDE_DIRECTORIES_abi_cxx11_);
    local_b8[0] = local_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b8,
               (anonymous_namespace)::propIMPORTED_CXX_MODULES_COMPILE_DEFINITIONS_abi_cxx11_,
               DAT_00b4a710 +
               (anonymous_namespace)::propIMPORTED_CXX_MODULES_COMPILE_DEFINITIONS_abi_cxx11_);
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,
               (anonymous_namespace)::propIMPORTED_CXX_MODULES_COMPILE_FEATURES_abi_cxx11_,
               DAT_00b4a730 +
               (anonymous_namespace)::propIMPORTED_CXX_MODULES_COMPILE_FEATURES_abi_cxx11_);
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,
               (anonymous_namespace)::propIMPORTED_CXX_MODULES_COMPILE_OPTIONS_abi_cxx11_,
               DAT_00b4a750 +
               (anonymous_namespace)::propIMPORTED_CXX_MODULES_COMPILE_OPTIONS_abi_cxx11_);
    plVar12 = local_48;
    local_58[0] = plVar12;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,
               (anonymous_namespace)::propIMPORTED_CXX_MODULES_LINK_LIBRARIES_abi_cxx11_,
               DAT_00b4a770 +
               (anonymous_namespace)::propIMPORTED_CXX_MODULES_LINK_LIBRARIES_abi_cxx11_);
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::_Hashtable<std::__cxx11::string_const*>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,local_3f8,
               local_38,0,local_438,&local_410,&local_449);
    lVar14 = -0x3c0;
    do {
      if (plVar12 != (long *)plVar12[-2]) {
        operator_delete((long *)plVar12[-2],*plVar12 + 1);
      }
      plVar12 = plVar12 + -4;
      lVar14 = lVar14 + 0x20;
    } while (lVar14 != 0);
    __cxa_atexit(std::
                 unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~unordered_set,&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_
                 ,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_);
    prop = local_440;
  }
  cVar9 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_._M_h,prop);
  if (cVar9.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
LAB_0035b89b:
    _Var2._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    local_438._0_8_ = &(_Var2._M_head_impl)->HeadersFileSets;
    local_438._8_8_ =
         (cmLinkedTree<cmStateDetail::SnapshotDataType> *)&(_Var2._M_head_impl)->CxxModulesFileSets;
    lVar14 = 0;
    do {
      psVar5 = *(string_view **)(local_438 + lVar14);
      local_448 = (this->impl)._M_t.
                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      pcVar3 = (prop->_M_dataplus)._M_p;
      pcVar13 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)prop->_M_string_length
      ;
      if ((pcVar13 == (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)psVar5[1]._M_len
          ) && ((pcVar13 == (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0 ||
                (iVar8 = bcmp(pcVar3,psVar5[1]._M_str,(size_t)pcVar13), iVar8 == 0)))) {
        local_3f8._0_8_ = local_3e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3f8,psVar5->_M_str,psVar5->_M_str + psVar5->_M_len);
        this_01 = (string *)
                  cmTargetInternals::GetFileSetDirectories
                            (local_448,this,(string *)local_3f8,*psVar5);
LAB_0035bad7:
        local_438._16_8_ = local_3e8._0_8_;
        pcVar13 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_3f8._0_8_;
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_3f8._0_8_ ==
            (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_3e8) {
          return (cmValue)this_01;
        }
        goto LAB_0035bbf4;
      }
      if ((pcVar13 == (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)psVar5[2]._M_len
          ) && ((pcVar13 == (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0 ||
                (iVar8 = bcmp(pcVar3,psVar5[2]._M_str,(size_t)pcVar13), iVar8 == 0)))) {
        local_3f8._0_8_ = local_3e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3f8,psVar5->_M_str,psVar5->_M_str + psVar5->_M_len);
        this_01 = (string *)
                  cmTargetInternals::GetFileSetPaths(local_448,this,(string *)local_3f8,*psVar5);
        goto LAB_0035bad7;
      }
      if ((pcVar13 == (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)psVar5[8]._M_len
          ) && ((pcVar13 == (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0 ||
                (iVar8 = bcmp(pcVar3,psVar5[8]._M_str,(size_t)pcVar13), iVar8 == 0)))) {
        if ((anonymous_namespace)::FileSetType::
            ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
            output_abi_cxx11_ == '\0') {
          GetProperty();
        }
        cmList::
        to_string<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                  ((string *)local_3f8,
                   (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(psVar5 + 9));
        puVar15 = (anonymous_namespace)::FileSetType::
                  ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                  ::output_abi_cxx11_;
LAB_0035bb47:
        std::__cxx11::string::operator=((string *)puVar15,(string *)local_3f8);
        this_01 = (string *)puVar15;
LAB_0035bbea:
        local_438._16_8_ = local_3e8._0_8_;
        pcVar13 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_3f8._0_8_;
        if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_3f8._0_8_ ==
            (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_3e8) {
          return (cmValue)this_01;
        }
        goto LAB_0035bbf4;
      }
      if ((pcVar13 ==
           (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)psVar5[10]._M_str) &&
         ((pcVar13 == (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0 ||
          (iVar8 = bcmp(pcVar3,(void *)psVar5[0xb]._M_len,(size_t)pcVar13), iVar8 == 0)))) {
        if ((anonymous_namespace)::FileSetType::
            ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)::
            output_abi_cxx11_ == '\0') {
          GetProperty();
        }
        cmList::
        to_string<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                  ((string *)local_3f8,
                   (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&psVar5[0xb]._M_str);
        puVar15 = (anonymous_namespace)::FileSetType::
                  ReadProperties(cmTarget_const*,cmTargetInternals_const*,std::__cxx11::string_const&)
                  ::output_abi_cxx11_;
        goto LAB_0035bb47;
      }
      local_3f8._0_8_ = pcVar13;
      local_3f8._8_8_ = pcVar3;
      iVar8 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_3f8,0,
                         psVar5[3]._M_len,psVar5[3]);
      prop = local_440;
      if (iVar8 == 0) {
        std::__cxx11::string::substr((ulong)local_3f8,(ulong)local_440);
        if ((pointer)local_3f8._8_8_ == (pointer)0x0) {
LAB_0035bbde:
          this_01 = (string *)0x0;
        }
        else {
          this_01 = (string *)
                    cmTargetInternals::GetFileSetDirectories
                              (local_448,this,(string *)local_3f8,*psVar5);
        }
        goto LAB_0035bbea;
      }
      local_3f8._8_8_ = (local_440->_M_dataplus)._M_p;
      local_3f8._0_8_ = local_440->_M_string_length;
      iVar8 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_3f8,0,
                         psVar5[4]._M_len,psVar5[4]);
      if (iVar8 == 0) {
        std::__cxx11::string::substr((ulong)local_3f8,(ulong)prop);
        if ((pointer)local_3f8._8_8_ == (pointer)0x0) goto LAB_0035bbde;
        this_01 = (string *)
                  cmTargetInternals::GetFileSetPaths(local_448,this,(string *)local_3f8,*psVar5);
        goto LAB_0035bbea;
      }
      lVar14 = lVar14 + 8;
    } while (lVar14 != 0x10);
    puVar15 = (undefined1 *)
              cmPropertyMap::GetPropertyValue
                        (&((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          Properties,prop);
    if ((string *)puVar15 == (string *)0x0) {
      this_00 = cmMakefile::GetState
                          (((this->impl)._M_t.
                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                            .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                           Makefile);
      puVar15 = (undefined1 *)0x0;
      bVar7 = cmState::IsPropertyChained(this_00,prop,TARGET);
      if (bVar7) {
        cmMakefile::GetStateSnapshot
                  (((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_3f8,(cmStateSnapshot *)local_438);
        puVar15 = (undefined1 *)
                  cmStateDirectory::GetProperty((cmStateDirectory *)local_3f8,prop,true);
      }
    }
  }
  else {
    sVar1 = prop->_M_string_length;
    if ((((((sVar1 == DAT_00b4a490) &&
           ((sVar1 == 0 ||
            (iVar8 = bcmp((prop->_M_dataplus)._M_p,(anonymous_namespace)::propC_STANDARD_abi_cxx11_,
                          sVar1), iVar8 == 0)))) ||
          ((sVar1 == DAT_00b4a4b0 &&
           ((sVar1 == 0 ||
            (iVar8 = bcmp((prop->_M_dataplus)._M_p,
                          (anonymous_namespace)::propCXX_STANDARD_abi_cxx11_,sVar1), iVar8 == 0)))))
          ) || ((sVar1 == DAT_00b4a4d0 &&
                ((sVar1 == 0 ||
                 (iVar8 = bcmp((prop->_M_dataplus)._M_p,
                               (anonymous_namespace)::propCUDA_STANDARD_abi_cxx11_,sVar1),
                 iVar8 == 0)))))) ||
        ((sVar1 == DAT_00b4a4f0 &&
         ((sVar1 == 0 ||
          (iVar8 = bcmp((prop->_M_dataplus)._M_p,(anonymous_namespace)::propHIP_STANDARD_abi_cxx11_,
                        sVar1), iVar8 == 0)))))) ||
       (((sVar1 == DAT_00b4a510 &&
         ((sVar1 == 0 ||
          (iVar8 = bcmp((prop->_M_dataplus)._M_p,(anonymous_namespace)::propOBJC_STANDARD_abi_cxx11_
                        ,sVar1), iVar8 == 0)))) ||
        (_Var6 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&(anonymous_namespace)::propOBJCXX_STANDARD_abi_cxx11_),
        _Var6)))) {
      iVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::find(&(((this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                       LanguageStandardProperties)._M_t,prop);
      if (iVar10._M_node !=
          (_Base_ptr)
          ((long)&((this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                  LanguageStandardProperties + 8U)) {
        return (cmValue)(iVar10._M_node + 2);
      }
      return (cmValue)(_Base_ptr)0x0;
    }
    _Var2._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    auVar16._8_4_ = (int)_Var2._M_head_impl;
    auVar16._0_8_ = _Var2._M_head_impl;
    auVar16._12_4_ = (int)((ulong)_Var2._M_head_impl >> 0x20);
    lVar14 = auVar16._8_8_;
    local_3e8._0_8_ = (cmState *)&(_Var2._M_head_impl)->CompileFeatures;
    local_3e8._8_8_ = (pointer)(lVar14 + 0x328);
    local_3f8._0_8_ =
         (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
         &(_Var2._M_head_impl)->IncludeDirectories;
    local_3f8._8_8_ = (pointer)(lVar14 + 0x2c8);
    local_3c8._0_8_ =
         (cmLinkedTree<cmStateDetail::SnapshotDataType> *)&(_Var2._M_head_impl)->LinkOptions;
    local_3c8._8_8_ = (pointer)(lVar14 + 1000);
    local_3d8 = (pointer)&(_Var2._M_head_impl)->PrecompileHeaders;
    puStack_3d0 = (pointer)(lVar14 + 0x388);
    local_3a8._M_allocated_capacity = (size_type)&(_Var2._M_head_impl)->InterfaceLinkLibrariesDirect
    ;
    local_3a8._8_8_ = lVar14 + 0x4a8;
    local_3b8._M_p = (pointer)&(_Var2._M_head_impl)->LinkLibraries;
    sStack_3b0 = lVar14 + 0x448;
    local_388._M_allocated_capacity =
         (size_type)&(_Var2._M_head_impl)->ImportedCxxModulesCompileFeatures;
    local_388._8_8_ = lVar14 + 0x568;
    local_398._M_p = (pointer)&(_Var2._M_head_impl)->ImportedCxxModulesIncludeDirectories;
    sStack_390 = lVar14 + 0x508;
    local_378[0] = (pointer)&(_Var2._M_head_impl)->ImportedCxxModulesLinkLibraries;
    pcVar3 = (prop->_M_dataplus)._M_p;
    sVar1 = prop->_M_string_length;
    lVar14 = 0;
    do {
      psVar4 = *(size_t **)(local_3f8 + lVar14);
      if ((*psVar4 == sVar1) &&
         ((sVar1 == 0 || (iVar8 = bcmp(pcVar3,(void *)psVar4[1],sVar1), iVar8 == 0)))) {
        if (psVar4[3] == psVar4[4]) {
          return (cmValue)(_Base_ptr)0x0;
        }
        if ((anonymous_namespace)::UsageRequirementProperty::Read(std::__cxx11::string_const&)::
            output_abi_cxx11_ == '\0') {
          GetProperty();
        }
        cmList::
        to_string<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_0>
                  ((string *)local_438,
                   (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(psVar4 + 3));
        this_01 = (string *)
                  (anonymous_namespace)::UsageRequirementProperty::Read(std::__cxx11::string_const&)
                  ::output_abi_cxx11_;
        goto LAB_0035b6dc;
      }
      prop = local_440;
      lVar14 = lVar14 + 8;
    } while (lVar14 != 0x88);
    _Var6 = std::operator==(local_440,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &(anonymous_namespace)::propTYPE_abi_cxx11_);
    if (_Var6) {
      p_Var11 = (_Base_ptr)
                cmState::GetTargetTypeName_abi_cxx11_
                          (((this->impl)._M_t.
                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                            .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                           TargetType);
      return (cmValue)p_Var11;
    }
    _Var6 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&(anonymous_namespace)::
                                     propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
    if (_Var6) {
      if (*(size_t *)
           ((long)&((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Utilities +
           0x28) == 0) {
        return (cmValue)(_Base_ptr)0x0;
      }
      if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
        GetProperty();
      }
      if (GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_ == '\0') {
        GetProperty();
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_,
               *(size_t *)
                ((long)&((this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Utilities
                + 0x28));
      _Var2._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      std::
      transform<std::_Rb_tree_const_iterator<BT<std::pair<std::__cxx11::string,bool>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmTarget::GetProperty(std::__cxx11::string_const&)const::__0>
                (*(_Base_ptr *)((long)&(_Var2._M_head_impl)->Utilities + 0x18),
                 (_Rb_tree_header *)((long)&(_Var2._M_head_impl)->Utilities + 8),
                 GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      cmList::
      to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                ((string *)local_438,&GetProperty(std::__cxx11::string_const&)::utilities_abi_cxx11_
                );
      this_01 = &GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_;
LAB_0035b6dc:
      std::__cxx11::string::operator=((string *)this_01,(string *)local_438);
      pcVar13 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_438._0_8_;
      if ((undefined1 *)local_438._0_8_ == local_438 + 0x10) {
        return (cmValue)this_01;
      }
LAB_0035bbf4:
      operator_delete(pcVar13,(ulong)&(((cmState *)local_438._16_8_)->PropertyDefinitions).Map_._M_t
                                      ._M_impl.field_0x1);
      return (cmValue)this_01;
    }
    _Var6 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&(anonymous_namespace)::propIMPORTED_abi_cxx11_);
    if (_Var6) {
      bVar7 = cmTargetInternals::IsImported
                        ((this->impl)._M_t.
                         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                         .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl);
    }
    else {
      _Var6 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&(anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_);
      if (!_Var6) {
        _Var6 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::propNAME_abi_cxx11_);
        if (_Var6) {
          return (cmValue)(_Base_ptr)
                          &((this->impl)._M_t.
                            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                            .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Name;
        }
        _Var6 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::propBINARY_DIR_abi_cxx11_);
        if (_Var6) {
          cmMakefile::GetStateSnapshot
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          cmStateSnapshot::GetDirectory((cmStateDirectory *)local_438,&local_410);
          p_Var11 = (_Base_ptr)
                    cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_438);
          return (cmValue)p_Var11;
        }
        _Var6 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::propSOURCE_DIR_abi_cxx11_);
        if (_Var6) {
          cmMakefile::GetStateSnapshot
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          cmStateSnapshot::GetDirectory((cmStateDirectory *)local_438,&local_410);
          p_Var11 = (_Base_ptr)
                    cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_438);
          return (cmValue)p_Var11;
        }
        goto LAB_0035b89b;
      }
      bVar7 = IsImportedGloballyVisible(this);
    }
    puVar15 = (anonymous_namespace)::propFALSE_abi_cxx11_;
    if (bVar7 != false) {
      puVar15 = (anonymous_namespace)::propTRUE_abi_cxx11_;
    }
  }
  return (cmValue)(string *)puVar15;
}

Assistant:

cmValue cmTarget::GetProperty(const std::string& prop) const
{
  static std::unordered_set<std::string> const specialProps{
    propC_STANDARD,
    propCXX_STANDARD,
    propCUDA_STANDARD,
    propHIP_STANDARD,
    propOBJC_STANDARD,
    propOBJCXX_STANDARD,
    propLINK_LIBRARIES,
    propTYPE,
    propINCLUDE_DIRECTORIES,
    propCOMPILE_FEATURES,
    propCOMPILE_OPTIONS,
    propCOMPILE_DEFINITIONS,
    propPRECOMPILE_HEADERS,
    propLINK_OPTIONS,
    propLINK_DIRECTORIES,
    propIMPORTED,
    propIMPORTED_GLOBAL,
    propMANUALLY_ADDED_DEPENDENCIES,
    propNAME,
    propBINARY_DIR,
    propSOURCE_DIR,
    propSOURCES,
    propINTERFACE_LINK_LIBRARIES,
    propINTERFACE_LINK_LIBRARIES_DIRECT,
    propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE,
    propIMPORTED_CXX_MODULES_INCLUDE_DIRECTORIES,
    propIMPORTED_CXX_MODULES_COMPILE_DEFINITIONS,
    propIMPORTED_CXX_MODULES_COMPILE_FEATURES,
    propIMPORTED_CXX_MODULES_COMPILE_OPTIONS,
    propIMPORTED_CXX_MODULES_LINK_LIBRARIES,
  };
  if (specialProps.count(prop)) {
    if (prop == propC_STANDARD || prop == propCXX_STANDARD ||
        prop == propCUDA_STANDARD || prop == propHIP_STANDARD ||
        prop == propOBJC_STANDARD || prop == propOBJCXX_STANDARD) {
      auto propertyIter = this->impl->LanguageStandardProperties.find(prop);
      if (propertyIter == this->impl->LanguageStandardProperties.end()) {
        return nullptr;
      }
      return cmValue(propertyIter->second.Value);
    }

    UsageRequirementProperty const* usageRequirements[] = {
      &this->impl->IncludeDirectories,
      &this->impl->CompileOptions,
      &this->impl->CompileFeatures,
      &this->impl->CompileDefinitions,
      &this->impl->PrecompileHeaders,
      &this->impl->Sources,
      &this->impl->LinkOptions,
      &this->impl->LinkDirectories,
      &this->impl->LinkLibraries,
      &this->impl->InterfaceLinkLibraries,
      &this->impl->InterfaceLinkLibrariesDirect,
      &this->impl->InterfaceLinkLibrariesDirectExclude,
      &this->impl->ImportedCxxModulesIncludeDirectories,
      &this->impl->ImportedCxxModulesCompileDefinitions,
      &this->impl->ImportedCxxModulesCompileFeatures,
      &this->impl->ImportedCxxModulesCompileOptions,
      &this->impl->ImportedCxxModulesLinkLibraries,
    };

    for (auto const* usageRequirement : usageRequirements) {
      auto value = usageRequirement->Read(prop);
      if (value.first) {
        return value.second;
      }
    }

    // the type property returns what type the target is
    if (prop == propTYPE) {
      return cmValue(cmState::GetTargetTypeName(this->GetType()));
    }
    if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
      if (this->impl->Utilities.empty()) {
        return nullptr;
      }

      static std::string output;
      static std::vector<std::string> utilities;
      utilities.resize(this->impl->Utilities.size());
      std::transform(
        this->impl->Utilities.cbegin(), this->impl->Utilities.cend(),
        utilities.begin(),
        [](const BT<std::pair<std::string, bool>>& item) -> std::string {
          return item.Value.first;
        });
      output = cmList::to_string(utilities);
      return cmValue(output);
    }
    if (prop == propIMPORTED) {
      return this->IsImported() ? cmValue(propTRUE) : cmValue(propFALSE);
    }
    if (prop == propIMPORTED_GLOBAL) {
      return this->IsImportedGloballyVisible() ? cmValue(propTRUE)
                                               : cmValue(propFALSE);
    }
    if (prop == propNAME) {
      return cmValue(this->GetName());
    }
    if (prop == propBINARY_DIR) {
      return cmValue(this->impl->Makefile->GetStateSnapshot()
                       .GetDirectory()
                       .GetCurrentBinary());
    }
    if (prop == propSOURCE_DIR) {
      return cmValue(this->impl->Makefile->GetStateSnapshot()
                       .GetDirectory()
                       .GetCurrentSource());
    }
  }

  // Check fileset properties.
  {
    FileSetType* fileSetTypes[] = {
      &this->impl->HeadersFileSets,
      &this->impl->CxxModulesFileSets,
    };

    for (auto* fileSetType : fileSetTypes) {
      auto value = fileSetType->ReadProperties(this, this->impl.get(), prop);
      if (value.first) {
        return value.second;
      }
    }
  }

  cmValue retVal = this->impl->Properties.GetPropertyValue(prop);
  if (!retVal) {
    const bool chain = this->impl->Makefile->GetState()->IsPropertyChained(
      prop, cmProperty::TARGET);
    if (chain) {
      return this->impl->Makefile->GetStateSnapshot()
        .GetDirectory()
        .GetProperty(prop, chain);
    }
    return nullptr;
  }
  return retVal;
}